

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
Chainstate::ConnectTip
          (Chainstate *this,BlockValidationState *state,CBlockIndex *pindexNew,
          shared_ptr<const_CBlock> *pblock,ConnectTrace *connectTrace,
          DisconnectedBlockTransactions *disconnectpool)

{
  duration *pdVar1;
  long lVar2;
  pointer ppCVar3;
  Notifications *notifications;
  ValidationSignals *this_00;
  ChainstateManager *pCVar4;
  element_type *block;
  bool bVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  CCoinsViewCache *baseIn;
  long lVar9;
  Chainstate *pCVar10;
  CBlockIndex *pCVar11;
  char *pcVar12;
  byte unaff_R12B;
  long in_FS_OFFSET;
  double dVar13;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  shared_ptr<const_CBlock> pblock_00;
  element_type *local_288;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_280;
  shared_ptr<const_CBlock> pthisBlock;
  string local_260;
  double local_240 [4];
  shared_ptr<CBlock> pblockNew;
  CCoinsViewCache view;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar3 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar3 ==
      (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar11 = (CBlockIndex *)0x0;
  }
  else {
    pCVar11 = ppCVar3[-1];
  }
  if (pindexNew->pprev != pCVar11) {
    __assert_fail("pindexNew->pprev == m_chain.Tip()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xc3e,
                  "bool Chainstate::ConnectTip(BlockValidationState &, CBlockIndex *, const std::shared_ptr<const CBlock> &, ConnectTrace &, DisconnectedBlockTransactions &)"
                 );
  }
  lVar7 = std::chrono::_V2::steady_clock::now();
  pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    std::make_shared<CBlock>();
    bVar5 = ::node::BlockManager::ReadBlockFromDisk
                      (this->m_blockman,
                       pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       pindexNew);
    if (bVar5) {
      std::__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2> *)&pthisBlock,
                 &pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>);
    }
    else {
      notifications = (this->m_chainman->m_options).notifications;
      _((bilingual_str *)&view,(ConstevalStringLiteral)0x6c401a);
      unaff_R12B = FatalError(notifications,state,(bilingual_str *)&view);
      bilingual_str::~bilingual_str((bilingual_str *)&view);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (!bVar5) goto LAB_003605ab;
  }
  else {
    bVar5 = ::LogAcceptCategory(BENCH,Debug);
    if (bVar5) {
      logging_function._M_str = "ConnectTip";
      logging_function._M_len = 10;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x5e;
      LogPrintFormatInternal<>
                (logging_function,source_file,0xc49,BENCH,Debug,(ConstevalFormatString<0U>)0x6c403b)
      ;
    }
    std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>,
               &pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>);
  }
  block = pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar8 = std::chrono::_V2::steady_clock::now();
  bVar5 = ::LogAcceptCategory(BENCH,Debug);
  if (bVar5) {
    view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
         (_func_int **)((double)(lVar8 - lVar7) / 1000000.0);
    logging_function_00._M_str = "ConnectTip";
    logging_function_00._M_len = 10;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file_00._M_len = 0x5e;
    LogPrintFormatInternal<double>
              (logging_function_00,source_file_00,0xc53,BENCH,Debug,
               (ConstevalFormatString<1U>)0x6c4053,(double *)&view);
  }
  baseIn = CoinsTip(this);
  CCoinsViewCache::CCoinsViewCache(&view,(CCoinsView *)baseIn,false);
  bVar5 = ConnectBlock(this,block,state,pindexNew,&view,false);
  this_00 = (this->m_chainman->m_options).signals;
  if (this_00 != (ValidationSignals *)0x0) {
    ValidationSignals::BlockChecked(this_00,block,state);
  }
  if (bVar5) {
    lVar9 = std::chrono::_V2::steady_clock::now();
    pCVar4 = this->m_chainman;
    pdVar1 = &pCVar4->time_connect_total;
    pdVar1->__r = pdVar1->__r + (lVar9 - lVar8);
    if (pCVar4->num_blocks_total < 1) {
      __assert_fail("m_chainman.num_blocks_total > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ,0xc62,
                    "bool Chainstate::ConnectTip(BlockValidationState &, CBlockIndex *, const std::shared_ptr<const CBlock> &, ConnectTrace &, DisconnectedBlockTransactions &)"
                   );
    }
    bVar6 = ::LogAcceptCategory(BENCH,Debug);
    if (bVar6) {
      pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)((double)(lVar9 - lVar8) / 1000000.0);
      dVar13 = (double)(this->m_chainman->time_connect_total).__r;
      local_240[0] = dVar13 / 1000000000.0;
      local_260._M_dataplus._M_p =
           (pointer)((dVar13 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
      logging_function_01._M_str = "ConnectTip";
      logging_function_01._M_len = 10;
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_01._M_len = 0x5e;
      LogPrintFormatInternal<double,double,double>
                (logging_function_01,source_file_01,0xc66,BENCH,Debug,
                 (ConstevalFormatString<3U>)0x6c40b5,(double *)&pblockNew,local_240,
                 (double *)&local_260);
    }
    bVar6 = CCoinsViewCache::Flush(&view);
    if (!bVar6) {
      __assert_fail("flushed",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ,0xc68,
                    "bool Chainstate::ConnectTip(BlockValidationState &, CBlockIndex *, const std::shared_ptr<const CBlock> &, ConnectTrace &, DisconnectedBlockTransactions &)"
                   );
    }
  }
  else {
    if ((state->super_ValidationState<BlockValidationResult>).m_mode == M_INVALID) {
      InvalidBlockFound(this,pindexNew,state);
    }
    CBlockIndex::GetBlockHash((uint256 *)local_240,pindexNew);
    base_blob<256u>::ToString_abi_cxx11_((string *)&pblockNew,(base_blob<256u> *)local_240);
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
              (&local_260,&state->super_ValidationState<BlockValidationResult>);
    logging_function_02._M_str = "ConnectTip";
    logging_function_02._M_len = 10;
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file_02._M_len = 0x5e;
    LogPrintFormatInternal<char[11],std::__cxx11::string,std::__cxx11::string>
              (logging_function_02,source_file_02,0xc5d,ALL,Error,
               (ConstevalFormatString<3U>)0x6c4075,(char (*) [11])"ConnectTip",(string *)&pblockNew,
               &local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&pblockNew);
    lVar9 = 0;
    unaff_R12B = 0;
  }
  CCoinsViewCache::~CCoinsViewCache(&view);
  if (bVar5) {
    lVar8 = std::chrono::_V2::steady_clock::now();
    pdVar1 = &this->m_chainman->time_flush;
    pdVar1->__r = pdVar1->__r + (lVar8 - lVar9);
    bVar5 = ::LogAcceptCategory(BENCH,Debug);
    if (bVar5) {
      view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
           (_func_int **)((double)(lVar8 - lVar9) / 1000000.0);
      dVar13 = (double)(this->m_chainman->time_flush).__r;
      pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(dVar13 / 1000000000.0);
      local_240[0] = (dVar13 / 1000000.0) / (double)this->m_chainman->num_blocks_total;
      logging_function_03._M_str = "ConnectTip";
      logging_function_03._M_len = 10;
      source_file_03._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_03._M_len = 0x5e;
      LogPrintFormatInternal<double,double,double>
                (logging_function_03,source_file_03,0xc6f,BENCH,Debug,
                 (ConstevalFormatString<3U>)0x6c40e5,(double *)&view,(double *)&pblockNew,local_240)
      ;
    }
    pcVar12 = (char *)0x0;
    bVar5 = FlushStateToDisk(this,state,IF_NEEDED,0);
    if (bVar5) {
      lVar9 = std::chrono::_V2::steady_clock::now();
      pdVar1 = &this->m_chainman->time_chainstate;
      pdVar1->__r = pdVar1->__r + (lVar9 - lVar8);
      bVar5 = ::LogAcceptCategory(BENCH,Debug);
      if (bVar5) {
        view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
             (_func_int **)((double)(lVar9 - lVar8) / 1000000.0);
        dVar13 = (double)(this->m_chainman->time_chainstate).__r;
        pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(dVar13 / 1000000000.0);
        local_240[0] = (dVar13 / 1000000.0) / (double)this->m_chainman->num_blocks_total;
        logging_function_04._M_str = "ConnectTip";
        logging_function_04._M_len = 10;
        source_file_04._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_04._M_len = 0x5e;
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        LogPrintFormatInternal<double,double,double>
                  (logging_function_04,source_file_04,0xc79,BENCH,Debug,
                   (ConstevalFormatString<3U>)0x6c410d,(double *)&view,(double *)&pblockNew,
                   local_240);
      }
      if (this->m_mempool != (CTxMemPool *)0x0) {
        CTxMemPool::removeForBlock(this->m_mempool,&block->vtx,pindexNew->nHeight);
        DisconnectedBlockTransactions::removeForBlock(disconnectpool,&block->vtx);
      }
      CChain::SetTip(&this->m_chain,pindexNew);
      UpdateTip(this,pindexNew);
      lVar8 = std::chrono::_V2::steady_clock::now();
      pCVar4 = this->m_chainman;
      pdVar1 = &pCVar4->time_post_connect;
      pdVar1->__r = pdVar1->__r + (lVar8 - lVar9);
      pdVar1 = &pCVar4->time_total;
      pdVar1->__r = pdVar1->__r + (lVar8 - lVar7);
      bVar5 = ::LogAcceptCategory(BENCH,Debug);
      if (bVar5) {
        view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
             (_func_int **)((double)(lVar8 - lVar9) / 1000000.0);
        dVar13 = (double)(this->m_chainman->time_post_connect).__r;
        pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(dVar13 / 1000000000.0);
        local_240[0] = (dVar13 / 1000000.0) / (double)this->m_chainman->num_blocks_total;
        logging_function_05._M_str = "ConnectTip";
        logging_function_05._M_len = 10;
        source_file_05._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_05._M_len = 0x5e;
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        LogPrintFormatInternal<double,double,double>
                  (logging_function_05,source_file_05,0xc89,BENCH,Debug,
                   (ConstevalFormatString<3U>)0x6c4142,(double *)&view,(double *)&pblockNew,
                   local_240);
      }
      bVar5 = ::LogAcceptCategory(BENCH,Debug);
      if (bVar5) {
        view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
             (_func_int **)((double)(lVar8 - lVar7) / 1000000.0);
        dVar13 = (double)(this->m_chainman->time_total).__r;
        pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(dVar13 / 1000000000.0);
        local_240[0] = (dVar13 / 1000000.0) / (double)this->m_chainman->num_blocks_total;
        logging_function_06._M_str = "ConnectTip";
        logging_function_06._M_len = 10;
        source_file_06._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_06._M_len = 0x5e;
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        LogPrintFormatInternal<double,double,double>
                  (logging_function_06,source_file_06,0xc8d,BENCH,Debug,
                   (ConstevalFormatString<3U>)0x6c4178,(double *)&view,(double *)&pblockNew,
                   local_240);
      }
      pCVar10 = ChainstateManager::ActiveChainstate(this->m_chainman);
      if (pCVar10 != this) {
        ChainstateManager::MaybeCompleteSnapshotValidation(this->m_chainman);
      }
      local_288 = pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Stack_280._M_pi =
           pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar12;
      pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_288;
      ConnectTrace::BlockConnected(connectTrace,pindexNew,pblock_00);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_280);
      unaff_R12B = 1;
    }
    else {
      unaff_R12B = 0;
    }
  }
LAB_003605ab:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (bool)(unaff_R12B & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::ConnectTip(BlockValidationState& state, CBlockIndex* pindexNew, const std::shared_ptr<const CBlock>& pblock, ConnectTrace& connectTrace, DisconnectedBlockTransactions& disconnectpool)
{
    AssertLockHeld(cs_main);
    if (m_mempool) AssertLockHeld(m_mempool->cs);

    assert(pindexNew->pprev == m_chain.Tip());
    // Read block from disk.
    const auto time_1{SteadyClock::now()};
    std::shared_ptr<const CBlock> pthisBlock;
    if (!pblock) {
        std::shared_ptr<CBlock> pblockNew = std::make_shared<CBlock>();
        if (!m_blockman.ReadBlockFromDisk(*pblockNew, *pindexNew)) {
            return FatalError(m_chainman.GetNotifications(), state, _("Failed to read block."));
        }
        pthisBlock = pblockNew;
    } else {
        LogDebug(BCLog::BENCH, "  - Using cached block\n");
        pthisBlock = pblock;
    }
    const CBlock& blockConnecting = *pthisBlock;
    // Apply the block atomically to the chain state.
    const auto time_2{SteadyClock::now()};
    SteadyClock::time_point time_3;
    // When adding aggregate statistics in the future, keep in mind that
    // num_blocks_total may be zero until the ConnectBlock() call below.
    LogDebug(BCLog::BENCH, "  - Load block from disk: %.2fms\n",
             Ticks<MillisecondsDouble>(time_2 - time_1));
    {
        CCoinsViewCache view(&CoinsTip());
        bool rv = ConnectBlock(blockConnecting, state, pindexNew, view);
        if (m_chainman.m_options.signals) {
            m_chainman.m_options.signals->BlockChecked(blockConnecting, state);
        }
        if (!rv) {
            if (state.IsInvalid())
                InvalidBlockFound(pindexNew, state);
            LogError("%s: ConnectBlock %s failed, %s\n", __func__, pindexNew->GetBlockHash().ToString(), state.ToString());
            return false;
        }
        time_3 = SteadyClock::now();
        m_chainman.time_connect_total += time_3 - time_2;
        assert(m_chainman.num_blocks_total > 0);
        LogDebug(BCLog::BENCH, "  - Connect total: %.2fms [%.2fs (%.2fms/blk)]\n",
                 Ticks<MillisecondsDouble>(time_3 - time_2),
                 Ticks<SecondsDouble>(m_chainman.time_connect_total),
                 Ticks<MillisecondsDouble>(m_chainman.time_connect_total) / m_chainman.num_blocks_total);
        bool flushed = view.Flush();
        assert(flushed);
    }
    const auto time_4{SteadyClock::now()};
    m_chainman.time_flush += time_4 - time_3;
    LogDebug(BCLog::BENCH, "  - Flush: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_4 - time_3),
             Ticks<SecondsDouble>(m_chainman.time_flush),
             Ticks<MillisecondsDouble>(m_chainman.time_flush) / m_chainman.num_blocks_total);
    // Write the chain state to disk, if necessary.
    if (!FlushStateToDisk(state, FlushStateMode::IF_NEEDED)) {
        return false;
    }
    const auto time_5{SteadyClock::now()};
    m_chainman.time_chainstate += time_5 - time_4;
    LogDebug(BCLog::BENCH, "  - Writing chainstate: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_5 - time_4),
             Ticks<SecondsDouble>(m_chainman.time_chainstate),
             Ticks<MillisecondsDouble>(m_chainman.time_chainstate) / m_chainman.num_blocks_total);
    // Remove conflicting transactions from the mempool.;
    if (m_mempool) {
        m_mempool->removeForBlock(blockConnecting.vtx, pindexNew->nHeight);
        disconnectpool.removeForBlock(blockConnecting.vtx);
    }
    // Update m_chain & related variables.
    m_chain.SetTip(*pindexNew);
    UpdateTip(pindexNew);

    const auto time_6{SteadyClock::now()};
    m_chainman.time_post_connect += time_6 - time_5;
    m_chainman.time_total += time_6 - time_1;
    LogDebug(BCLog::BENCH, "  - Connect postprocess: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_6 - time_5),
             Ticks<SecondsDouble>(m_chainman.time_post_connect),
             Ticks<MillisecondsDouble>(m_chainman.time_post_connect) / m_chainman.num_blocks_total);
    LogDebug(BCLog::BENCH, "- Connect block: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_6 - time_1),
             Ticks<SecondsDouble>(m_chainman.time_total),
             Ticks<MillisecondsDouble>(m_chainman.time_total) / m_chainman.num_blocks_total);

    // If we are the background validation chainstate, check to see if we are done
    // validating the snapshot (i.e. our tip has reached the snapshot's base block).
    if (this != &m_chainman.ActiveChainstate()) {
        // This call may set `m_disabled`, which is referenced immediately afterwards in
        // ActivateBestChain, so that we stop connecting blocks past the snapshot base.
        m_chainman.MaybeCompleteSnapshotValidation();
    }

    connectTrace.BlockConnected(pindexNew, std::move(pthisBlock));
    return true;
}